

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

optional<baryonyx::objective_function_type> read_objective_type(string_view token)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string_view rhs_02;
  string_view rhs_03;
  string_view rhs_04;
  
  uVar2 = 0x100000000;
  rhs._M_str = "maximize";
  rhs._M_len = 8;
  bVar1 = are_equal(token,rhs);
  if (((bVar1) ||
      (rhs_00._M_str = "maximum", rhs_00._M_len = 7, bVar1 = are_equal(token,rhs_00), bVar1)) ||
     (rhs_01._M_str = "max", rhs_01._M_len = 3, bVar1 = are_equal(token,rhs_01), bVar1)) {
    uVar3 = 0;
  }
  else {
    rhs_02._M_str = "minimize";
    rhs_02._M_len = 8;
    bVar1 = are_equal(token,rhs_02);
    uVar3 = 1;
    if ((!bVar1) &&
       (rhs_03._M_str = "minimum", rhs_03._M_len = 7, bVar1 = are_equal(token,rhs_03), !bVar1)) {
      rhs_04._M_str = "min";
      rhs_04._M_len = 3;
      bVar1 = are_equal(token,rhs_04);
      if (!bVar1) {
        uVar2 = 0;
      }
    }
  }
  return (_Optional_base<baryonyx::objective_function_type,_true,_true>)
         (_Optional_base<baryonyx::objective_function_type,_true,_true>)(uVar3 | uVar2);
}

Assistant:

std::optional<baryonyx::objective_function_type>
read_objective_type(const std::string_view token) noexcept
{
    if (are_equal(token, "maximize") || are_equal(token, "maximum") ||
        are_equal(token, "max"))
        return baryonyx::objective_function_type::maximize;

    if (are_equal(token, "minimize") || are_equal(token, "minimum") ||
        are_equal(token, "min"))
        return baryonyx::objective_function_type::minimize;

    return std::nullopt;
}